

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

bool __thiscall FIX::SessionState::retrieve(SessionState *this,int msgSeqNum,Message *message)

{
  pointer ppVar1;
  _Self local_50 [3];
  _Self local_38;
  iterator i;
  Locker l;
  Message *message_local;
  SessionState *pSStack_18;
  int msgSeqNum_local;
  SessionState *this_local;
  
  message_local._4_4_ = msgSeqNum;
  pSStack_18 = this;
  Locker::Locker((Locker *)&i,&this->m_mutex);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::Message,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::Message>_>_>
       ::find(&this->m_queue,(key_type *)((long)&message_local + 4));
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::Message,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::Message>_>_>
       ::end(&this->m_queue);
  this_local._7_1_ = std::operator!=(&local_38,local_50);
  if ((bool)this_local._7_1_) {
    ppVar1 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::Message>_>::operator->(&local_38);
    Message::operator=(message,&ppVar1->second);
    std::map<int,FIX::Message,std::less<int>,std::allocator<std::pair<int_const,FIX::Message>>>::
    erase_abi_cxx11_((map<int,FIX::Message,std::less<int>,std::allocator<std::pair<int_const,FIX::Message>>>
                      *)&this->m_queue,(iterator)local_38._M_node);
  }
  Locker::~Locker((Locker *)&i);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool retrieve( int msgSeqNum, Message& message )
  {
    Locker l( m_mutex );
    Messages::iterator i = m_queue.find( msgSeqNum );
    if ( i != m_queue.end() )
    {
      message = i->second;
      m_queue.erase( i );
      return true;
    }
    return false;
  }